

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::unicodeReplacement(string *unit_string)

{
  const_iterator pvVar1;
  char *pcVar2;
  byte *pbVar3;
  size_t codelength;
  size_type fnd;
  value_type *ucode;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<const_char_*,_const_char_*>,_66UL> *__range1;
  bool changed;
  string *unit_string_local;
  
  __range1._7_1_ = false;
  __end1 = std::array<std::pair<const_char_*,_const_char_*>,_66UL>::begin
                     (&unicodeReplacement::ucodeReplacements);
  pvVar1 = std::array<std::pair<const_char_*,_const_char_*>,_66UL>::end
                     (&unicodeReplacement::ucodeReplacements);
LAB_001b07db:
  if (__end1 == pvVar1) {
    return __range1._7_1_;
  }
  codelength = std::__cxx11::string::find((char *)unit_string,(ulong)__end1->first);
LAB_001b0809:
  do {
    if (codelength == 0xffffffffffffffff) break;
    pcVar2 = (char *)strlen(__end1->first);
    if ((pcVar2 == (char *)0x1) && (codelength != 0)) {
      pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)unit_string);
      if (0xc0 < *pbVar3) {
        codelength = std::__cxx11::string::find((char *)unit_string,(ulong)__end1->first);
        goto LAB_001b0809;
      }
    }
    __range1._7_1_ = true;
    std::__cxx11::string::replace((ulong)unit_string,codelength,pcVar2);
    if (codelength != 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      if (*pcVar2 == '\\') {
        std::__cxx11::string::erase((ulong)unit_string,codelength - 1);
      }
    }
    pcVar2 = __end1->first;
    strlen(__end1->second);
    codelength = std::__cxx11::string::find((char *)unit_string,(ulong)pcVar2);
  } while( true );
  __end1 = __end1 + 1;
  goto LAB_001b07db;
}

Assistant:

static bool unicodeReplacement(std::string& unit_string)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 66>
        ucodeReplacements{{
            ckpair{u8"\u00d7", "*"},
            ckpair{u8"\u00f7", "/"},  // division sign
            ckpair{u8"\u00b7", "*"},
            ckpair{u8"\u2217", "*"},  // asterisk operator
            ckpair{u8"\u00B5", "u"},
            ckpair{u8"\u03BC", "u"},
            ckpair{u8"\u00E9", "e"},
            ckpair{u8"\u00E8", "e"},
            ckpair{u8"\u0301", ""},  // just get rid of the accent
            ckpair{u8"\u0300", ""},  // just get rid of the accent
            ckpair{u8"\u2212", "-"},
            ckpair{u8"\u2009", ""},  // thin space
            ckpair{u8"\u2007", ""},  // thin space
            ckpair{u8"\u202f", ""},  // narrow no break space
            ckpair{u8"\u207B\u00B9", "^(-1)"},
            ckpair{u8"\u207B\u00B2", "^(-2)"},
            ckpair{u8"\u207B\u00B3", "^(-3)"},
            ckpair{u8"\u207B\u2074", "^(-4)"},
            ckpair{u8"\u207B\u2075", "^(-5)"},
            ckpair{u8"\u207B\u2076", "^(-6)"},
            ckpair{u8"\u207B\u2077", "^(-7)"},
            ckpair{u8"\u207B\u2078", "^(-8)"},
            ckpair{u8"\u207B\u2079", "^(-9)"},
            ckpair{u8"-\u00B9", "^(-1)"},
            ckpair{u8"-\u00B2", "^(-2)"},
            ckpair{u8"-\u00B3", "^(-3)"},
            ckpair{u8"-\u2074", "^(-4)"},
            ckpair{u8"-\u2075", "^(-5)"},
            ckpair{u8"-\u2076", "^(-6)"},
            ckpair{u8"-\u2077", "^(-7)"},
            ckpair{u8"-\u2078", "^(-8)"},
            ckpair{u8"-\u2079", "^(-9)"},
            ckpair{u8"\u00b9", "*"},  // superscript 1 which doesn't do
                                      // anything
            ckpair{u8"\u00b2", "^(2)"},
            ckpair{u8"\u00b3", "^(3)"},
            ckpair{u8"\u2074", "^(4)"},
            ckpair{u8"\u2075", "^(5)"},
            ckpair{u8"\u2076", "^(6)"},
            ckpair{u8"\u2077", "^(7)"},
            ckpair{u8"\u2078", "^(8)"},
            ckpair{u8"\u2079", "^(9)"},
            ckpair{u8"\u2215", "/"},  // Division slash
            ckpair{u8"\u00BD", "(0.5)"},  // (1/2) fraction
            ckpair{u8"\u00BC", "(0.25)"},  // (1/4) fraction
            ckpair{u8"\u00BE", "(0.75)"},  // (3/4) fraction
            ckpair{u8"\u2153", "(1/3)"},  // (1/3) fraction
            ckpair{u8"\u2154", "(2/3)"},  // (2/3) fraction
            ckpair{u8"\u215B", "0.125"},  // (1/8) fraction
            ckpair{u8"\u215F", "1/"},  // 1/ numerator operator
            ckpair{u8"\u20AC", "\x80"},  // euro sign to extended ascii
            ckpair{u8"\u20BD", "ruble"},  // Ruble sign
            ckpair{u8"\u01B7", "dr_ap"},  // drachm symbol
            ckpair{"-\xb3", "^(-3)"},
            ckpair{"-\xb9", "^(-1)"},
            ckpair{"-\xb2", "^(-2)"},
            ckpair{"\xb3", "^(3)"},
            ckpair{"\xb9", "*"},
            // superscript 1 which doesn't do anything, replace with
            // multiply
            ckpair{"\xb2", "^(2)"},
            ckpair{"\xf7", "/"},
            ckpair{"\xB7", "*"},
            ckpair{"\xD7", "*"},
            ckpair{"\xE9", "e"},  // remove accent
            ckpair{"\xE8", "e"},  // remove accent
            ckpair{"\xBD", "(0.5)"},  // (1/2) fraction
            ckpair{"\xBC", "(0.25)"},  // (1/4) fraction
            ckpair{"\xBE", "(0.75)"},  // (3/4) fraction
        }};
    bool changed{false};
    for (const auto& ucode : ucodeReplacements) {
        auto fnd = unit_string.find(ucode.first);
        while (fnd != std::string::npos) {
            std::size_t codelength = strlen(ucode.first);
            if (codelength == 1 && fnd > 0 &&
                static_cast<unsigned char>(unit_string[fnd - 1]) > 0xC0) {
                // skip the conversion in this case as it is likely a unicode
                // sequence
                fnd = unit_string.find(ucode.first, fnd + 1);
                continue;
            }
            changed = true;
            unit_string.replace(fnd, codelength, ucode.second);
            if (fnd > 0 && unit_string[fnd - 1] == '\\') {
                unit_string.erase(fnd - 1, 1);
                --fnd;
            }
            fnd = unit_string.find(ucode.first, fnd + strlen(ucode.second));
        }
    }
    return changed;
}